

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdEmuD3D0TexFilter::emulate_mthd(MthdEmuD3D0TexFilter *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar3 = (uint)((long)((ulong)uVar2 << 0x28) >> 0x29) & 0xff0000;
  uVar2 = uVar2 & 0x1e1e;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[0] &
       0x770061e1 | uVar2 | uVar3 | 0x88000000;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[1] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.d3d56_tex_filter[1] &
       0x770061e1 | uVar2 | uVar3 | 0x88000000;
  pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 6)
  ;
  *pbVar1 = *pbVar1 | 0x81;
  return;
}

Assistant:

void emulate_mthd() override {
		for (int i = 0; i < 2; i++) {
			insrt(exp.d3d56_tex_filter[i], 1, 4, extr(val, 1, 4));
			insrt(exp.d3d56_tex_filter[i], 9, 4, extr(val, 9, 4));
			insrt(exp.d3d56_tex_filter[i], 15, 1, 0);
			insrt(exp.d3d56_tex_filter[i], 16, 8, extrs(val, 17, 7));
			insrt(exp.d3d56_tex_filter[i], 27, 1, 1);
			insrt(exp.d3d56_tex_filter[i], 31, 1, 1);
		}
		insrt(exp.valid[1], 23, 1, 1);
		insrt(exp.valid[1], 16, 1, 1);
	}